

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

vector_s<int,_10UL> * __thiscall
estl::vector_s<int,_10UL>::operator=(vector_s<int,_10UL> *this,initializer_list<int> ilist)

{
  const_iterator last;
  size_type sVar1;
  pointer insert_ptr;
  size_type i;
  size_type diff;
  const_iterator end;
  const_iterator it;
  vector_s<int,_10UL> *this_local;
  initializer_list<int> ilist_local;
  
  ilist_local._M_array = (iterator)ilist._M_len;
  this_local = (vector_s<int,_10UL> *)ilist._M_array;
  end = std::initializer_list<int>::begin((initializer_list<int> *)&this_local);
  last = std::initializer_list<int>::end((initializer_list<int> *)&this_local);
  sVar1 = vector_s<int,10ul>::check_range<int_const*>((vector_s<int,10ul> *)this,end,last);
  insert_ptr = (pointer)0x0;
  for (; end != last; end = end + 1) {
    this->data_ptr_[(long)insert_ptr] = *end;
    insert_ptr = (pointer)((long)insert_ptr + 1);
  }
  this->size_ = sVar1;
  return this;
}

Assistant:

vector_s& operator=(std::initializer_list<T> ilist)
    {
        auto it = ilist.begin();
        const auto end = ilist.end();
        const auto diff = check_range(it, end);
        size_type i = 0u;
        for (; it != end; ++it, ++i) {
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(*it); // TODO: Is it OK to move here! Elements are already copied into initializer_list?
        }
        size_ = diff;
        return *this;
    }